

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O2

void __thiscall
wallet::coinselector_tests::check_max_selection_weight::test_method
          (check_max_selection_weight *this)

{
  long lVar1;
  readonly_property<bool> rVar2;
  T *pTVar3;
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *psVar4;
  _Any_data *p_Var5;
  iterator pvVar6;
  NodeContext *pNVar7;
  iterator pvVar8;
  NodeContext *m_node;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  check_type cVar10;
  int *piVar9;
  char *local_578;
  char *local_570;
  undefined1 *local_568;
  undefined1 *local_560;
  char *local_558;
  char *local_550;
  _Any_data local_548;
  code *local_538;
  code *local_530;
  char *local_528;
  char *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  _Any_data local_498;
  code *local_488;
  code *local_480;
  char *local_470;
  char *local_468;
  undefined1 *local_460;
  undefined1 *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  lazy_ostream local_3f0;
  undefined1 *local_3e0;
  char **local_3d8;
  assertion_result local_3d0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  _Any_data local_398;
  code *local_388;
  code *local_380;
  int max_weight;
  CAmount target;
  CoinSelectionParams local_360;
  Result<wallet::SelectionResult> result;
  FastRandomContext rand;
  CCoinControl cc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  target = 4950000000;
  CCoinControl::CCoinControl(&cc);
  FastRandomContext::FastRandomContext(&rand,false);
  local_360.change_output_size = 0x22;
  local_360.change_spend_size = 0x44;
  local_360.m_min_change_target = 1000000;
  local_360.min_viable_change = 0;
  local_360.m_change_fee = 0;
  local_360.m_cost_of_change = 0;
  local_360.m_effective_feerate.nSatoshisPerK = 0;
  local_360.m_long_term_feerate.nSatoshisPerK = 0;
  local_360.m_discard_feerate.nSatoshisPerK = 0;
  local_360.tx_noinputs_size = 0x2c;
  local_360.m_subtract_fee_outputs = false;
  local_360.m_avoid_partial_spends = false;
  local_360.m_include_unsafe_inputs = false;
  local_360.m_max_tx_weight.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int> =
       (_Optional_base<int,_true,_true>)(_Optional_payload<int,_true,_true,_true>)0x0;
  max_weight = 0x61948;
  p_Var5 = &local_398;
  local_398._M_unused._M_object = (void *)0x0;
  local_398._8_8_ = 0;
  local_380 = std::
              _Function_handler<wallet::CoinsResult_(wallet::CWallet_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp:1446:36)>
              ::_M_invoke;
  local_388 = std::
              _Function_handler<wallet::CoinsResult_(wallet::CWallet_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp:1446:36)>
              ::_M_manager;
  m_node = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
            super_BasicTestingSetup.m_node;
  pNVar7 = m_node;
  local_360.rng_fast = &rand;
  select_coins(&result,&target,&local_360,&cc,
               (function<wallet::CoinsResult_(wallet::CWallet_&)> *)p_Var5,m_node);
  std::_Function_base::~_Function_base((_Function_base *)&local_398);
  local_3a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_3a0 = "";
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x5b1;
  file.m_begin = (iterator)&local_3a8;
  msg.m_end = (iterator)pNVar7;
  msg.m_begin = (iterator)p_Var5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_3b8,msg);
  local_3d0.m_message.px = (element_type *)0x0;
  local_3d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_400 = "result";
  local_3f8 = "";
  local_3f0.m_empty = false;
  local_3f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_3e0 = boost::unit_test::lazy_ostream::inst;
  local_410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_408 = "";
  pvVar6 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_3d8 = &local_400;
  local_3d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       (result.m_variant.super__Variant_base<bilingual_str,_wallet::SelectionResult>.
        super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_index == '\x01');
  boost::test_tools::tt_detail::report_assertion
            (&local_3d0,&local_3f0,1,0,WARN,_cVar10,(size_t)&local_410,0x5b1);
  boost::detail::shared_count::~shared_count(&local_3d0.m_message.pn);
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_418 = "";
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x5b3;
  file_00.m_begin = (iterator)&local_420;
  msg_00.m_end = pvVar8;
  msg_00.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_430,
             msg_00);
  pTVar3 = util::Result<wallet::SelectionResult>::value(&result);
  psVar4 = SelectionResult::GetInputSet(pTVar3);
  local_3d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)has_coin(psVar4,5000000000);
  local_3d0.m_message.px = (element_type *)0x0;
  local_3d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_400 = "has_coin(result->GetInputSet(), CAmount(50 * COIN))";
  local_3f8 = "";
  local_3f0.m_empty = false;
  local_3f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_3e0 = boost::unit_test::lazy_ostream::inst;
  local_440 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_438 = "";
  pvVar6 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_3d8 = &local_400;
  boost::test_tools::tt_detail::report_assertion
            (&local_3d0,&local_3f0,1,0,WARN,_cVar10,(size_t)&local_440,0x5b3);
  boost::detail::shared_count::~shared_count(&local_3d0.m_message.pn);
  local_450 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_448 = "";
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x5b4;
  file_01.m_begin = (iterator)&local_450;
  msg_01.m_end = pvVar8;
  msg_01.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_460,
             msg_01);
  local_3f0.m_empty = false;
  local_3f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_3e0 = boost::unit_test::lazy_ostream::inst;
  local_3d8 = (char **)0xc7f1cc;
  local_470 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_468 = "";
  pTVar3 = util::Result<wallet::SelectionResult>::value(&result);
  local_3d0._0_4_ = pTVar3->m_weight;
  piVar9 = &max_weight;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::le_impl,int,int>
            (&local_3f0,&local_470,0x5b4,1,5,&local_3d0,"result->GetWeight()",piVar9,"max_weight");
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::SelectionResult>::
  ~_Variant_storage((_Variant_storage<false,_bilingual_str,_wallet::SelectionResult> *)&result);
  p_Var5 = &local_498;
  local_498._M_unused._M_object = (void *)0x0;
  local_498._8_8_ = 0;
  local_480 = std::
              _Function_handler<wallet::CoinsResult_(wallet::CWallet_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp:1472:36)>
              ::_M_invoke;
  local_488 = std::
              _Function_handler<wallet::CoinsResult_(wallet::CWallet_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp:1472:36)>
              ::_M_manager;
  pNVar7 = m_node;
  select_coins(&result,&target,&local_360,&cc,
               (function<wallet::CoinsResult_(wallet::CWallet_&)> *)p_Var5,m_node);
  std::_Function_base::~_Function_base((_Function_base *)&local_498);
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_4a0 = "";
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x5cc;
  file_02.m_begin = (iterator)&local_4a8;
  msg_02.m_end = (iterator)pNVar7;
  msg_02.m_begin = (iterator)p_Var5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_4b8,
             msg_02);
  pTVar3 = util::Result<wallet::SelectionResult>::value(&result);
  psVar4 = SelectionResult::GetInputSet(pTVar3);
  rVar2.super_class_property<bool>.value = (class_property<bool>)has_coin(psVar4,0x5f5e10);
  local_3d0.m_message.px = (element_type *)0x0;
  local_3d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_400 = "has_coin(result->GetInputSet(), CAmount(0.0625 * COIN))";
  local_3f8 = "";
  local_3f0.m_empty = false;
  local_3f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_3e0 = boost::unit_test::lazy_ostream::inst;
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_4c0 = "";
  pvVar6 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_3d8 = &local_400;
  local_3d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar2.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_3d0,&local_3f0,1,0,WARN,(check_type)piVar9,(size_t)&local_4c8,0x5cc);
  boost::detail::shared_count::~shared_count(&local_3d0.m_message.pn);
  local_4d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_4d0 = "";
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x5cd;
  file_03.m_begin = (iterator)&local_4d8;
  msg_03.m_end = pvVar8;
  msg_03.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_4e8,
             msg_03);
  pTVar3 = util::Result<wallet::SelectionResult>::value(&result);
  psVar4 = SelectionResult::GetInputSet(pTVar3);
  local_3d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)has_coin(psVar4,2500000);
  local_3d0.m_message.px = (element_type *)0x0;
  local_3d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_400 = "has_coin(result->GetInputSet(), CAmount(0.025 * COIN))";
  local_3f8 = "";
  local_3f0.m_empty = false;
  local_3f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_3e0 = boost::unit_test::lazy_ostream::inst;
  local_4f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_4f0 = "";
  pvVar6 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_3d8 = &local_400;
  boost::test_tools::tt_detail::report_assertion
            (&local_3d0,&local_3f0,1,0,WARN,(check_type)piVar9,(size_t)&local_4f8,0x5cd);
  boost::detail::shared_count::~shared_count(&local_3d0.m_message.pn);
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_500 = "";
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x5ce;
  file_04.m_begin = (iterator)&local_508;
  msg_04.m_end = pvVar8;
  msg_04.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_518,
             msg_04);
  local_3f0.m_empty = false;
  local_3f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_3e0 = boost::unit_test::lazy_ostream::inst;
  local_3d8 = (char **)0xc7f1cc;
  local_528 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_520 = "";
  pTVar3 = util::Result<wallet::SelectionResult>::value(&result);
  local_3d0._0_4_ = pTVar3->m_weight;
  piVar9 = &max_weight;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::le_impl,int,int>
            (&local_3f0,&local_528,0x5ce,1,5,&local_3d0,"result->GetWeight()",piVar9,"max_weight");
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::SelectionResult>::
  ~_Variant_storage((_Variant_storage<false,_bilingual_str,_wallet::SelectionResult> *)&result);
  p_Var5 = &local_548;
  local_548._M_unused._M_object = (void *)0x0;
  local_548._8_8_ = 0;
  local_530 = std::
              _Function_handler<wallet::CoinsResult_(wallet::CWallet_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp:1497:36)>
              ::_M_invoke;
  local_538 = std::
              _Function_handler<wallet::CoinsResult_(wallet::CWallet_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp:1497:36)>
              ::_M_manager;
  select_coins(&result,&target,&local_360,&cc,
               (function<wallet::CoinsResult_(wallet::CWallet_&)> *)p_Var5,m_node);
  std::_Function_base::~_Function_base((_Function_base *)&local_548);
  local_558 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_550 = "";
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x5e5;
  file_05.m_begin = (iterator)&local_558;
  msg_05.m_end = (iterator)m_node;
  msg_05.m_begin = (iterator)p_Var5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_568,
             msg_05);
  local_3d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       (result.m_variant.super__Variant_base<bilingual_str,_wallet::SelectionResult>.
        super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_index != '\x01');
  local_3d0.m_message.px = (element_type *)0x0;
  local_3d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_400 = "!result";
  local_3f8 = "";
  local_3f0.m_empty = false;
  local_3f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_3e0 = boost::unit_test::lazy_ostream::inst;
  local_578 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_570 = "";
  local_3d8 = &local_400;
  boost::test_tools::tt_detail::report_assertion
            (&local_3d0,&local_3f0,1,0,WARN,(check_type)piVar9,(size_t)&local_578,0x5e5);
  boost::detail::shared_count::~shared_count(&local_3d0.m_message.pn);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::SelectionResult>::
  ~_Variant_storage((_Variant_storage<false,_bilingual_str,_wallet::SelectionResult> *)&result);
  ChaCha20::~ChaCha20(&rand.rng);
  CCoinControl::~CCoinControl(&cc);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(check_max_selection_weight)
{
    const CAmount target = 49.5L * COIN;
    CCoinControl cc;

    FastRandomContext rand;
    CoinSelectionParams cs_params{
        rand,
        /*change_output_size=*/34,
        /*change_spend_size=*/68,
        /*min_change_target=*/CENT,
        /*effective_feerate=*/CFeeRate(0),
        /*long_term_feerate=*/CFeeRate(0),
        /*discard_feerate=*/CFeeRate(0),
        /*tx_noinputs_size=*/10 + 34, // static header size + output size
        /*avoid_partial=*/false,
    };

    int max_weight = MAX_STANDARD_TX_WEIGHT - WITNESS_SCALE_FACTOR * (cs_params.tx_noinputs_size + cs_params.change_output_size);
    {
        // Scenario 1:
        // The actor starts with 1x 50.0 BTC and 1515x 0.033 BTC (~100.0 BTC total) unspent outputs
        // Then tries to spend 49.5 BTC
        // The 50.0 BTC output should be selected, because the transaction would otherwise be too large

        // Perform selection

        const auto result = select_coins(
            target, cs_params, cc, [&](CWallet& wallet) {
                CoinsResult available_coins;
                for (int j = 0; j < 1515; ++j) {
                    add_coin(available_coins, wallet, CAmount(0.033 * COIN), CFeeRate(0), 144, false, 0, true);
                }

                add_coin(available_coins, wallet, CAmount(50 * COIN), CFeeRate(0), 144, false, 0, true);
                return available_coins;
            },
            m_node);

        BOOST_CHECK(result);
        // Verify that the 50 BTC UTXO was selected, and result is below max_weight
        BOOST_CHECK(has_coin(result->GetInputSet(), CAmount(50 * COIN)));
        BOOST_CHECK_LE(result->GetWeight(), max_weight);
    }

    {
        // Scenario 2:

        // The actor starts with 400x 0.0625 BTC and 2000x 0.025 BTC (75.0 BTC total) unspent outputs
        // Then tries to spend 49.5 BTC
        // A combination of coins should be selected, such that the created transaction is not too large

        // Perform selection
        const auto result = select_coins(
            target, cs_params, cc, [&](CWallet& wallet) {
                CoinsResult available_coins;
                for (int j = 0; j < 400; ++j) {
                    add_coin(available_coins, wallet, CAmount(0.0625 * COIN), CFeeRate(0), 144, false, 0, true);
                }
                for (int j = 0; j < 2000; ++j) {
                    add_coin(available_coins, wallet, CAmount(0.025 * COIN), CFeeRate(0), 144, false, 0, true);
                }
                return available_coins;
            },
            m_node);

        BOOST_CHECK(has_coin(result->GetInputSet(), CAmount(0.0625 * COIN)));
        BOOST_CHECK(has_coin(result->GetInputSet(), CAmount(0.025 * COIN)));
        BOOST_CHECK_LE(result->GetWeight(), max_weight);
    }

    {
        // Scenario 3:

        // The actor starts with 1515x 0.033 BTC (49.995 BTC total) unspent outputs
        // No results should be returned, because the transaction would be too large

        // Perform selection
        const auto result = select_coins(
            target, cs_params, cc, [&](CWallet& wallet) {
                CoinsResult available_coins;
                for (int j = 0; j < 1515; ++j) {
                    add_coin(available_coins, wallet, CAmount(0.033 * COIN), CFeeRate(0), 144, false, 0, true);
                }
                return available_coins;
            },
            m_node);

        // No results
        // 1515 inputs * 68 bytes = 103,020 bytes
        // 103,020 bytes * 4 = 412,080 weight, which is above the MAX_STANDARD_TX_WEIGHT of 400,000
        BOOST_CHECK(!result);
    }
}